

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PointInstancer *instancer,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  value_type *rel;
  value_type *this_00;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *this_01;
  TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *pTVar3;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *this_02;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
  *this_03;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  *this_04;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
  *pTVar4;
  uint32_t indent_00;
  string *psVar5;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t indent_01;
  undefined7 in_register_00000081;
  string local_5a0;
  string local_580;
  string local_560;
  allocator local_539;
  undefined1 local_538 [32];
  string local_518;
  allocator local_4f1;
  undefined1 local_4f0 [32];
  string local_4d0;
  allocator local_4a9;
  undefined1 local_4a8 [32];
  string local_488;
  allocator local_461;
  undefined1 local_460 [32];
  string local_440;
  allocator local_419;
  undefined1 local_418 [32];
  string local_3f8;
  allocator local_3d1;
  undefined1 local_3d0 [32];
  string local_3b0;
  allocator local_389;
  undefined1 local_388 [32];
  string local_368;
  allocator local_341;
  undefined1 local_340 [32];
  string local_320;
  allocator local_2f9;
  undefined1 local_2f8 [32];
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  ListEditQual local_28c;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  PointInstancer *pPStack_18;
  uint32_t indent_local;
  PointInstancer *instancer_local;
  
  indent_01 = (uint32_t)CONCAT71(in_register_00000081,closing_brace);
  local_1c = (uint)instancer;
  local_1d = (byte)indent & 1;
  psVar5 = __return_storage_ptr__;
  pPStack_18 = (PointInstancer *)this;
  instancer_local = (PointInstancer *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar5;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)(pPStack_18->super_GPrim).spec,s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," PointInstancer \"");
  poVar2 = ::std::operator<<(poVar2,(string *)&(pPStack_18->super_GPrim).name);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored(&(pPStack_18->super_GPrim).meta);
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)&(pPStack_18->super_GPrim).meta,
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool
                    ((optional *)&pPStack_18->prototypes);
  if (bVar1) {
    rel = nonstd::optional_lite::optional<tinyusdz::Relationship>::value(&pPStack_18->prototypes);
    this_00 = nonstd::optional_lite::optional<tinyusdz::Relationship>::value
                        (&pPStack_18->prototypes);
    local_28c = Relationship::get_listedit_qual(this_00);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2b0,"prototypes",&local_2b1);
    psVar5 = &local_2b0;
    anon_unknown_173::print_relationship(&local_288,rel,&local_28c,false,psVar5,local_1c + 1);
    indent_01 = (uint32_t)psVar5;
    ::std::operator<<(aoStack_198,(string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_2b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  }
  this_01 = &pPStack_18->protoIndices;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2f8,"protoIndices",&local_2f9);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_2f8 + 0x20),(tinyusdz *)this_01,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_2f8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2f8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2f8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2f8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  pTVar3 = &pPStack_18->ids;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_340,"ids",&local_341);
  print_typed_attr<std::vector<long,std::allocator<long>>>
            ((string *)(local_340 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
             local_340,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_340 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_340 + 0x20));
  ::std::__cxx11::string::~string((string *)local_340);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_341);
  pTVar3 = &pPStack_18->invisibleIds;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_388,"invisibleIds",&local_389);
  print_typed_attr<std::vector<long,std::allocator<long>>>
            ((string *)(local_388 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_> *)
             local_388,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_388 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_388 + 0x20));
  ::std::__cxx11::string::~string((string *)local_388);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
  this_02 = &pPStack_18->positions;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_3d0,"positions",&local_3d1);
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            ((string *)(local_3d0 + 0x20),(tinyusdz *)this_02,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_3d0,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_3d0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_3d0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_3d0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  this_03 = &pPStack_18->orientations;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_418,"orientations",&local_419);
  print_typed_attr<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
            ((string *)(local_418 + 0x20),(tinyusdz *)this_03,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>_>_>
              *)local_418,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_418 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_418 + 0x20));
  ::std::__cxx11::string::~string((string *)local_418);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
  this_04 = &pPStack_18->scales;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_460,"scales",&local_461);
  print_typed_attr<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
            ((string *)(local_460 + 0x20),(tinyusdz *)this_04,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              *)local_460,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_460 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_460 + 0x20));
  ::std::__cxx11::string::~string((string *)local_460);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_461);
  pTVar4 = &pPStack_18->velocities;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_4a8,"velocities",&local_4a9);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ((string *)(local_4a8 + 0x20),(tinyusdz *)pTVar4,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_4a8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_4a8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_4a8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_4a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  pTVar4 = &pPStack_18->accelerations;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_4f0,"accelerations",&local_4f1);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ((string *)(local_4f0 + 0x20),(tinyusdz *)pTVar4,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_4f0,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_4f0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_4f0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_4f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  pTVar4 = &pPStack_18->angularVelocities;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_538,"angularVelocities",&local_539);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ((string *)(local_538 + 0x20),(tinyusdz *)pTVar4,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_538,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_538 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_538 + 0x20));
  ::std::__cxx11::string::~string((string *)local_538);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
  print_gprim_predefined<tinyusdz::PointInstancer>(&local_560,pPStack_18,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_560);
  ::std::__cxx11::string::~string((string *)&local_560);
  print_props(&local_580,&(pPStack_18->super_GPrim).props,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_580);
  ::std::__cxx11::string::~string((string *)&local_580);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_5a0,(pprint *)(ulong)local_1c,n_03);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_5a0);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_5a0);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const PointInstancer &instancer, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(instancer.spec)
     << " PointInstancer \"" << instancer.name << "\"\n";
  if (instancer.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(instancer.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  if (instancer.prototypes) {
    ss << print_relationship(instancer.prototypes.value(),
                             instancer.prototypes.value().get_listedit_qual(),
                             /* custom */ false, "prototypes", indent + 1);
  }
  ss << print_typed_attr(instancer.protoIndices, "protoIndices", indent + 1);
  ss << print_typed_attr(instancer.ids, "ids", indent + 1);
  ss << print_typed_attr(instancer.invisibleIds, "invisibleIds", indent + 1);
  ss << print_typed_attr(instancer.positions, "positions", indent + 1);
  ss << print_typed_attr(instancer.orientations, "orientations", indent + 1);
  ss << print_typed_attr(instancer.scales, "scales", indent + 1);
  ss << print_typed_attr(instancer.velocities, "velocities", indent + 1);
  ss << print_typed_attr(instancer.accelerations, "accelerations", indent + 1);
  ss << print_typed_attr(instancer.angularVelocities, "angularVelocities",
                         indent + 1);

  ss << print_gprim_predefined(instancer, indent + 1);

  ss << print_props(instancer.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}